

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_frame_codec.c
# Opt level: O2

void amqp_value_decoded(void *context,AMQP_VALUE decoded_value)

{
  int iVar1;
  _Bool _Var2;
  AMQP_VALUE descriptor;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  
  descriptor = amqpvalue_get_inplace_descriptor(decoded_value);
  if (descriptor == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00173758;
    pcVar4 = "Cannot get frame descriptor";
    iVar1 = 0x32;
  }
  else {
    _Var2 = is_sasl_mechanisms_type_by_descriptor(descriptor);
    if (_Var2) {
LAB_0017371e:
      *(AMQP_VALUE *)((long)context + 0x30) = decoded_value;
      return;
    }
    _Var2 = is_sasl_init_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0017371e;
    _Var2 = is_sasl_challenge_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0017371e;
    _Var2 = is_sasl_response_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0017371e;
    _Var2 = is_sasl_outcome_type_by_descriptor(descriptor);
    if (_Var2) goto LAB_0017371e;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00173758;
    pcVar4 = "Not a SASL frame";
    iVar1 = 0x41;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_frame_codec.c"
            ,"amqp_value_decoded",iVar1,1,pcVar4);
LAB_00173758:
  *(undefined4 *)((long)context + 0x28) = 1;
  (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
  return;
}

Assistant:

static void amqp_value_decoded(void* context, AMQP_VALUE decoded_value)
{
    SASL_FRAME_CODEC_INSTANCE* sasl_frame_codec_instance = (SASL_FRAME_CODEC_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(decoded_value);

    if (descriptor == NULL)
    {
        LogError("Cannot get frame descriptor");
        sasl_frame_codec_instance->decode_state = SASL_FRAME_DECODE_ERROR;

        /* Codes_SRS_SASL_FRAME_CODEC_01_049: [If any error occurs while decoding a frame, the decoder shall call the on_sasl_frame_codec_error and pass to it the callback_context, both of those being the ones given to sasl_frame_codec_create.] */
        sasl_frame_codec_instance->on_sasl_frame_codec_error(sasl_frame_codec_instance->callback_context);
    }
    else
    {
        /* Codes_SRS_SASL_FRAME_CODEC_01_009: [The frame body of a SASL frame MUST contain exactly one AMQP type, whose type encoding MUST have provides="sasl-frame".] */
        if (!is_sasl_mechanisms_type_by_descriptor(descriptor) &&
            !is_sasl_init_type_by_descriptor(descriptor) &&
            !is_sasl_challenge_type_by_descriptor(descriptor) &&
            !is_sasl_response_type_by_descriptor(descriptor) &&
            !is_sasl_outcome_type_by_descriptor(descriptor))
        {
            LogError("Not a SASL frame");
            sasl_frame_codec_instance->decode_state = SASL_FRAME_DECODE_ERROR;

            /* Codes_SRS_SASL_FRAME_CODEC_01_049: [If any error occurs while decoding a frame, the decoder shall call the on_sasl_frame_codec_error and pass to it the callback_context, both of those being the ones given to sasl_frame_codec_create.] */
            sasl_frame_codec_instance->on_sasl_frame_codec_error(sasl_frame_codec_instance->callback_context);
        }
        else
        {
            sasl_frame_codec_instance->decoded_sasl_frame_value = decoded_value;
        }
    }
}